

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O0

TimePoint __thiscall kj::anon_unknown_10::PosixMonotonicClock::now(PosixMonotonicClock *this)

{
  int osErrorNumber;
  void *pvVar1;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> AVar2;
  Quantity<long,_kj::_::NanosecondLabel> local_80;
  undefined8 local_78;
  Quantity<long,_kj::_::NanosecondLabel> local_70;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_68;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_60 [3];
  Fault local_48;
  Fault f;
  SyscallResult local_2c;
  long lStack_28;
  SyscallResult _kjSyscallResult;
  timespec ts;
  PosixMonotonicClock *this_local;
  
  f.exception = (Exception *)this;
  local_2c = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::PosixMonotonicClock::now()const::_lambda()_1_>
                       ((anon_class_16_2_e88081fa *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_2c);
  if (pvVar1 != (void *)0x0) {
    local_68 = origin<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>();
    local_78 = 1000000000;
    local_70 = operator*<long,_long,_kj::_::NanosecondLabel,_void>
                         (lStack_28,(Quantity<long,_kj::_::NanosecondLabel>)0x3b9aca00);
    local_60[0] = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator+
                            (&local_68,&local_70);
    local_80 = operator*<long,_long,_kj::_::NanosecondLabel,_void>
                         (ts.tv_sec,(Quantity<long,_kj::_::NanosecondLabel>)0x1);
    AVar2 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator+
                      (local_60,&local_80);
    return (Quantity<long,_kj::_::NanosecondLabel>)AVar2.value.value;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_2c);
  kj::_::Debug::Fault::Fault
            (&local_48,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time.c++"
             ,0xce,osErrorNumber,"clock_gettime(clockId, &ts)","");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

TimePoint now() const override {
    struct timespec ts;
    KJ_SYSCALL(clock_gettime(clockId, &ts));
    return kj::origin<TimePoint>() + ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
  }